

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall helics::CommonCore::checkDependencies(CommonCore *this)

{
  BaseTimeCoordinator *pBVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  FedInfo **ppFVar7;
  GlobalFederateId *dep_1;
  long lVar8;
  pointer pGVar9;
  FedInfo **ppFVar10;
  ulong uVar11;
  GlobalFederateId dest;
  FedInfo **ppFVar12;
  uint uVar13;
  GlobalFederateId dest_00;
  GlobalFederateId *dep;
  FedInfo *pFVar14;
  pointer pGVar15;
  ActionMessage rmdep;
  ActionMessage local_1a0;
  ActionMessage local_e8;
  
  if ((this->loopFederates).dataStorage.csize == 0) {
    uVar6 = (this->loopFederates).dataStorage.bsize;
    ppFVar7 = (this->loopFederates).dataStorage.dataptr;
    if ((long)(int)uVar6 == 0x20) {
      lVar8 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
      if (ppFVar7 == (FedInfo **)0x0) {
        ppFVar12 = (FedInfo **)
                   &gmlc::containers::
                    StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::end()::
                    emptyValue;
      }
      else {
        ppFVar12 = ppFVar7 + lVar8 + 1;
      }
      pFVar14 = *ppFVar12;
      uVar6 = 0;
      uVar13 = 0x20;
    }
    else {
      lVar8 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
      ppFVar12 = ppFVar7 + lVar8;
      pFVar14 = *ppFVar12 + (int)uVar6;
      uVar13 = uVar6;
    }
  }
  else {
    ppFVar7 = (this->loopFederates).dataStorage.dataptr;
    pFVar14 = *ppFVar7;
    lVar8 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
    uVar6 = 0;
    ppFVar12 = ppFVar7;
    uVar13 = (this->loopFederates).dataStorage.bsize;
  }
  if (ppFVar7 == (FedInfo **)0x0) {
    ppFVar10 = (FedInfo **)
               &gmlc::containers::
                StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::end()::
                emptyValue;
  }
  else {
    ppFVar10 = ppFVar7 + lVar8 + 1;
  }
  bVar2 = false;
  ppFVar7 = ppFVar7 + lVar8;
  if (uVar13 == 0x20) {
    uVar13 = 0;
    ppFVar7 = ppFVar10;
  }
  if ((uVar6 != uVar13) || (bVar4 = false, ppFVar12 != ppFVar7)) {
    bVar2 = false;
    bVar4 = false;
    do {
      iVar5 = FederateState::endpointCount(pFVar14->fed);
      if (0 < iVar5) {
        bVar3 = FederateState::getOptionFlag(pFVar14->fed,0);
        if (bVar3) {
          pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
          (*pBVar1->_vptr_BaseTimeCoordinator[6])
                    (pBVar1,(ulong)(uint)(pFVar14->fed->global_id)._M_i.gid);
          ActionMessage::ActionMessage(&local_1a0,cmd_remove_dependent);
          local_1a0.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
          local_1a0.dest_id.gid = (pFVar14->fed->global_id)._M_i.gid;
          FederateState::addAction(pFVar14->fed,&local_1a0);
          ActionMessage::~ActionMessage(&local_1a0);
          bVar2 = true;
        }
        else {
          bVar3 = FederateState::getOptionFlag(pFVar14->fed,4);
          if (bVar3) {
            pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
                     super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                     .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
            (*pBVar1->_vptr_BaseTimeCoordinator[7])
                      (pBVar1,(ulong)(uint)(pFVar14->fed->global_id)._M_i.gid);
            ActionMessage::ActionMessage(&local_1a0,cmd_remove_dependency);
            local_1a0.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
            local_1a0.dest_id.gid = (pFVar14->fed->global_id)._M_i.gid;
            FederateState::addAction(pFVar14->fed,&local_1a0);
            ActionMessage::~ActionMessage(&local_1a0);
            bVar4 = true;
          }
        }
      }
      if ((int)uVar6 < 0x1f) {
        pFVar14 = pFVar14 + 1;
        uVar6 = uVar6 + 1;
      }
      else {
        ppFVar12 = ppFVar12 + (ulong)(uVar6 - 0x1f >> 5) + 1;
        uVar6 = uVar6 + 1 & 0x1f;
        pFVar14 = (FedInfo *)((long)&(*ppFVar12)->fed + (ulong)(uVar6 << 4));
      }
    } while ((uVar6 != uVar13) || (ppFVar12 != ppFVar7));
  }
  BaseTimeCoordinator::getDependents
            ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
             &local_1a0,
             (this->super_BrokerBase).timeCoord._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
  uVar11 = CONCAT44(local_1a0.source_handle.hid,local_1a0.source_id.gid) - local_1a0._0_8_;
  if ((pointer)local_1a0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1a0._0_8_,
                    CONCAT44(local_1a0.dest_handle.hid,local_1a0.dest_id.gid) - local_1a0._0_8_);
  }
  if (uVar11 < 9) {
    BaseTimeCoordinator::getDependencies
              ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
               &local_1a0,
               (this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
    uVar11 = CONCAT44(local_1a0.source_handle.hid,local_1a0.source_id.gid) - local_1a0._0_8_;
    if ((pointer)local_1a0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1a0._0_8_,
                      CONCAT44(local_1a0.dest_handle.hid,local_1a0.dest_id.gid) - local_1a0._0_8_);
    }
    if (uVar11 < 9) {
      BaseTimeCoordinator::getDependents
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 &local_1a0,
                 (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
      pGVar9 = (pointer)CONCAT44(local_1a0.source_handle.hid,local_1a0.source_id.gid);
      if ((pointer)local_1a0._0_8_ == pGVar9) {
        iVar5 = 0;
        dest_00.gid = -2010000000;
        dest.gid = -2010000000;
      }
      else {
        dest.gid = -2010000000;
        iVar5 = 0;
        dest_00.gid = -2010000000;
        pGVar15 = (pointer)local_1a0._0_8_;
        do {
          bVar3 = isLocal(this,(GlobalFederateId)pGVar15->gid);
          if (bVar3) {
            iVar5 = iVar5 + 1;
            dest.gid = pGVar15->gid;
          }
          else {
            dest_00.gid = pGVar15->gid;
          }
          pGVar15 = pGVar15 + 1;
        } while (pGVar15 != pGVar9);
      }
      if ((pointer)local_1a0._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1a0._0_8_,
                        CONCAT44(local_1a0.dest_handle.hid,local_1a0.dest_id.gid) - local_1a0._0_8_)
        ;
      }
      if (iVar5 < 2) {
        if ((iVar5 == 0) && ((dest_00.gid == -1700000000 || (dest_00.gid == -2010000000)))) {
          (this->super_BrokerBase).hasTimeDependency = false;
        }
        else {
          BaseTimeCoordinator::getDependencies
                    ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                     &local_1a0,
                     (this->super_BrokerBase).timeCoord._M_t.
                     super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                     .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
          for (pGVar9 = (pointer)local_1a0._0_8_;
              pGVar9 != (pointer)CONCAT44(local_1a0.source_handle.hid,local_1a0.source_id.gid);
              pGVar9 = pGVar9 + 1) {
            if (pGVar9->gid != dest_00.gid && pGVar9->gid != dest.gid) {
              if ((pointer)local_1a0._0_8_ == (pointer)0x0) {
                return;
              }
              operator_delete((void *)local_1a0._0_8_,
                              CONCAT44(local_1a0.dest_handle.hid,local_1a0.dest_id.gid) -
                              local_1a0._0_8_);
              return;
            }
          }
          if ((pointer)local_1a0._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_1a0._0_8_,
                            CONCAT44(local_1a0.dest_handle.hid,local_1a0.dest_id.gid) -
                            local_1a0._0_8_);
          }
          pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
          (*pBVar1->_vptr_BaseTimeCoordinator[6])(pBVar1,(ulong)(uint)dest_00.gid);
          pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
          (*pBVar1->_vptr_BaseTimeCoordinator[6])(pBVar1,(ulong)(uint)dest.gid);
          pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
          (*pBVar1->_vptr_BaseTimeCoordinator[7])(pBVar1,(ulong)(uint)dest_00.gid);
          pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
          (*pBVar1->_vptr_BaseTimeCoordinator[7])(pBVar1,(ulong)(uint)dest.gid);
          (this->super_BrokerBase).hasTimeDependency = false;
          ActionMessage::ActionMessage(&local_1a0,cmd_remove_interdependency);
          local_1a0.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
          routeMessage(this,&local_1a0,dest_00);
          routeMessage(this,&local_1a0,dest);
          local_e8.source_id.gid = dest.gid;
          if (bVar2) {
            ActionMessage::ActionMessage(&local_e8,cmd_add_dependent);
            local_e8.flags = local_e8.flags | 0x4000;
            routeMessage(this,&local_e8,dest_00);
            ActionMessage::setAction(&local_e8,cmd_add_dependency);
            local_e8.flags = local_e8.flags & 0x9fff | 0x2000;
            local_e8.source_id.gid = dest_00.gid;
            routeMessage(this,&local_e8,dest);
          }
          else if (bVar4) {
            ActionMessage::ActionMessage(&local_e8,cmd_add_dependency);
            local_e8.flags = local_e8.flags | 0x4000;
            routeMessage(this,&local_e8,dest_00);
            ActionMessage::setAction(&local_e8,cmd_add_dependent);
            local_e8.flags = local_e8.flags & 0x9fff | 0x2000;
            local_e8.source_id.gid = dest_00.gid;
            routeMessage(this,&local_e8,dest);
          }
          else {
            ActionMessage::ActionMessage(&local_e8,cmd_add_interdependency);
            local_e8.flags = local_e8.flags | 0x4000;
            routeMessage(this,&local_e8,dest_00);
            routeMessage(this,&local_e8,dest);
            local_e8.flags = local_e8.flags & 0x9fff | 0x2000;
            local_e8.source_id.gid = dest_00.gid;
            routeMessage(this,&local_e8,dest);
          }
          ActionMessage::~ActionMessage(&local_e8);
          ActionMessage::~ActionMessage(&local_1a0);
        }
      }
    }
  }
  return;
}

Assistant:

FederateState* CommonCore::getFederate(std::string_view federateName) const
{
    auto feds = federates.lock();
    return feds->find(std::string(federateName));
}